

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDF_ERROR_CODE
qpdf_add_page_at(qpdf_data qpdf,qpdf_data newpage_qpdf,qpdf_oh newpage,QPDF_BOOL before,
                qpdf_oh refpage)

{
  QPDF_ERROR_CODE QVar1;
  anon_class_24_3_396807ea local_90;
  function<void_(_qpdf_data_*)> local_78;
  undefined1 local_48 [8];
  QPDFObjectHandle ref;
  QPDFObjectHandle page;
  qpdf_oh refpage_local;
  QPDF_BOOL before_local;
  qpdf_oh newpage_local;
  qpdf_data newpage_qpdf_local;
  qpdf_data qpdf_local;
  
  QTC::TC("qpdf","qpdf-c called qpdf_add_page_at",0);
  qpdf_oh_item_internal
            ((qpdf_data)
             &ref.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(qpdf_oh)newpage_qpdf);
  qpdf_oh_item_internal((qpdf_data)local_48,(qpdf_oh)qpdf);
  local_90.page =
       (QPDFObjectHandle *)
       &ref.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount;
  local_90.ref = (QPDFObjectHandle *)local_48;
  local_90.before = before;
  std::function<void(_qpdf_data*)>::function<qpdf_add_page_at::__0,void>
            ((function<void(_qpdf_data*)> *)&local_78,&local_90);
  QVar1 = trap_errors(qpdf,&local_78);
  std::function<void_(_qpdf_data_*)>::~function(&local_78);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_48);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &ref.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return QVar1;
}

Assistant:

QPDF_ERROR_CODE
qpdf_add_page_at(
    qpdf_data qpdf, qpdf_data newpage_qpdf, qpdf_oh newpage, QPDF_BOOL before, qpdf_oh refpage)
{
    QTC::TC("qpdf", "qpdf-c called qpdf_add_page_at");
    auto page = qpdf_oh_item_internal(newpage_qpdf, newpage);
    auto ref = qpdf_oh_item_internal(qpdf, refpage);
    return trap_errors(
        qpdf, [&page, before, &ref](qpdf_data q) { q->qpdf->addPageAt(page, before, ref); });
}